

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

void __thiscall
EncodeHelper::Init(EncodeHelper *this,size_t _cbNeeded,uchar *pOut,size_t cbOut,uchar type,
                  size_t cbData)

{
  overflow_error *this_00;
  uchar *out;
  size_t cbOut_00;
  size_t *cbUsed;
  size_t cbData_local;
  uchar type_local;
  size_t cbOut_local;
  uchar *pOut_local;
  size_t _cbNeeded_local;
  EncodeHelper *this_local;
  
  this->cbNeeded = _cbNeeded;
  if ((this->cbNeeded <= cbOut) && (1 < cbOut)) {
    *pOut = type;
    this->offset = 1;
    out = DataPtr(this,pOut);
    cbOut_00 = DataSize(this);
    cbUsed = CurrentSize(this);
    EncodeSize(cbData,out,cbOut_00,cbUsed);
    Update(this);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"Overflow in Encode");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void Init(size_t _cbNeeded, unsigned char* pOut, size_t cbOut, unsigned char type, size_t cbData)
    { 
        cbNeeded = _cbNeeded; 
        if(cbNeeded > cbOut || cbOut < 2)
            throw std::overflow_error("Overflow in Encode");

        // Set the type
        *pOut = type;
        offset = 1;

        EncodeSize(cbData, DataPtr(pOut), DataSize(), CurrentSize());
        Update();
    }